

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O3

int jsimd_can_h2v2_merged_upsample(void)

{
  uint uVar1;
  
  init_simd();
  uVar1 = 1;
  if (-1 < (char)simd_support) {
    uVar1 = (simd_support & 8) >> 3;
  }
  return uVar1;
}

Assistant:

GLOBAL(int)
jsimd_can_h2v2_merged_upsample(void)
{
  init_simd();

  /* The code is optimised for these values only */
  if (BITS_IN_JSAMPLE != 8)
    return 0;
  if (sizeof(JDIMENSION) != 4)
    return 0;

  if ((simd_support & JSIMD_AVX2) &&
      IS_ALIGNED_AVX(jconst_merged_upsample_avx2))
    return 1;
  if ((simd_support & JSIMD_SSE2) &&
      IS_ALIGNED_SSE(jconst_merged_upsample_sse2))
    return 1;

  return 0;
}